

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

void __thiscall cppnet::RWSocket::~RWSocket(RWSocket *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  AlloterWrap *this_00;
  Dispatcher *this_01;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RWSocket_001333d8;
  (this->super_CNSocket)._vptr_CNSocket = (_func_int **)&DAT_00133498;
  p_Var4 = (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  this_00 = (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if ((this_00 != (AlloterWrap *)0x0) && (this->_event != (Event *)0x0)) {
    AlloterWrap::PoolDelete<cppnet::Event>(this_00,&this->_event);
  }
  if (this->_timer_id != 0) {
    p_Var4 = (this->super_Socket)._dispatcher.
             super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar3 = p_Var4->_M_use_count;
      do {
        if (iVar3 == 0) {
          p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar2 = p_Var4->_M_use_count;
        bVar5 = iVar3 == iVar2;
        if (bVar5) {
          p_Var4->_M_use_count = iVar3 + 1;
          iVar2 = iVar3;
        }
        iVar3 = iVar2;
        UNLOCK();
      } while (!bVar5);
    }
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = p_Var4->_M_use_count == 0;
    }
    this_01 = (this->super_Socket)._dispatcher.
              super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (!(bool)(this_01 == (Dispatcher *)0x0 | bVar5)) {
      Dispatcher::StopTimer(this_01,this->_timer_id);
    }
    this->_timer_id = 0;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  p_Var4 = (this->_block_pool).
           super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->_alloter).super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->_read_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->_write_buffer).super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  p_Var4 = (this->super_enable_shared_from_this<cppnet::RWSocket>)._M_weak_this.
           super___weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
    }
  }
  Socket::~Socket(&this->super_Socket);
  return;
}

Assistant:

RWSocket::~RWSocket() {
    _write_buffer.reset();
    _read_buffer.reset();
    if (_alloter && _event) {
        _alloter->PoolDelete(_event);
    }
    if (_timer_id > 0) {
        auto dispatcher = GetDispatcher();
        if (dispatcher) {
            dispatcher->StopTimer(_timer_id);
        }
        _timer_id = 0;
    }
}